

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
::write_decimal<int>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
           *this,int value)

{
  wchar_t *pwVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  internal *piVar5;
  wchar_t *local_50;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined8 uStack_3c;
  
  piVar5._0_4_ = (internal *)-value;
  if (0 < value) {
    piVar5._0_4_ = (internal *)value;
  }
  iVar4 = internal::count_digits((uint32_t)piVar5._0_4_);
  if (value < 0) {
    pwVar1 = (this->out_).super_truncating_iterator_base<wchar_t_*>.out_;
    uVar2 = (this->out_).super_truncating_iterator_base<wchar_t_*>.count_;
    uVar3 = (this->out_).super_truncating_iterator_base<wchar_t_*>.limit_;
    internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>::operator++
              (&this->out_);
    if (uVar2 < uVar3) {
      *pwVar1 = L'-';
    }
  }
  internal::
  format_decimal<wchar_t,unsigned_int,fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,fmt::v5::internal::no_thousands_sep>
            (&local_50,piVar5._0_4_,iVar4);
  *(ulong *)((long)&(this->out_).super_truncating_iterator_base<wchar_t_*>.limit_ + 4) =
       CONCAT44(uStack_40,uStack_44);
  *(undefined8 *)((long)&(this->out_).super_truncating_iterator_base<wchar_t_*>.count_ + 4) =
       uStack_3c;
  (this->out_).super_truncating_iterator_base<wchar_t_*>.out_ = local_50;
  (this->out_).super_truncating_iterator_base<wchar_t_*>.limit_ = CONCAT44(uStack_44,uStack_48);
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }